

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O3

uint __thiscall BasePort::GetBroadcastReadSizeQuads(BasePort *this)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  uVar1 = 0x110;
  if (this->IsAllBoardsRev4_6_ == false) {
    if (this->IsAllBoardsRev7_ == false) {
      uVar1 = this->max_board;
      if (uVar1 == 0) {
        uVar1 = 1;
      }
      else {
        uVar3 = 0;
        iVar2 = 0;
        do {
          if (this->BoardList[uVar3] != (BoardIO *)0x0) {
            uVar1 = (*this->BoardList[uVar3]->_vptr_BoardIO[1])();
            iVar2 = iVar2 + (uVar1 >> 2) + 1;
            uVar1 = this->max_board;
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < uVar1);
        uVar1 = iVar2 + 1;
      }
    }
    else {
      uVar1 = this->NumOfBoards_ * 0x1d + 1;
    }
  }
  return uVar1;
}

Assistant:

unsigned int BasePort::GetBroadcastReadSizeQuads(void) const
{
    unsigned int bcReadSize;                    // Broadcast read size (depends on firmware version)
    if (IsAllBoardsRev4_6_)
        bcReadSize = 17*BoardIO::MAX_BOARDS;    // Rev 1-6: 16 * 17 = 272 max (though really should have been 16*21)
    else if (IsAllBoardsRev7_)
        bcReadSize = 29*NumOfBoards_+1;         // Rev 7: NumOfBoards * (1 seq + 28 data) + 1
    else {                                      // Rev 8+
        bcReadSize = 0;
        for (unsigned int boardNum = 0; boardNum < max_board; boardNum++) {
            BoardIO *board = BoardList[boardNum];
            if (board)
                bcReadSize += board->GetReadNumBytes()/sizeof(quadlet_t) + 1;
        }
        bcReadSize += 1;                       // Add one quadlet for timing info at end
    }
    return bcReadSize;
}